

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void image_manipulation::resize_and_pad_image
               (clip_image_u8 *image,clip_image_u8 *dst,clip_image_size *target_resolution,
               array<unsigned_char,_3UL> pad_color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer puVar3;
  pointer puVar4;
  uint target_height;
  int iVar5;
  int iVar6;
  int iVar7;
  int target_width;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int c;
  long lVar13;
  ulong uVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  clip_image_u8 resized_image;
  undefined1 local_90 [16];
  pointer local_80;
  undefined8 local_78;
  int iStack_70;
  int iStack_6c;
  undefined1 local_68 [24];
  pointer local_50;
  clip_image_size local_48;
  undefined8 uStack_40;
  
  local_48 = *target_resolution;
  iVar18 = local_48.width;
  iStack_70 = local_48.height;
  auVar16._0_4_ = (float)iVar18;
  auVar16._4_4_ = (float)iStack_70;
  auVar16._8_8_ = 0;
  uVar1 = image->nx;
  uVar2 = image->ny;
  auVar17._4_4_ = (float)(int)uVar2;
  auVar17._0_4_ = (float)(int)uVar1;
  auVar17._8_8_ = 0;
  auVar17 = divps(auVar16,auVar17);
  uVar8 = (ulong)local_48 & 0xffffffff;
  uStack_40 = 0;
  local_78 = (clip_image_u8 *)CONCAT44(iStack_70,iStack_70);
  iStack_6c = iStack_70;
  if (auVar17._4_4_ <= auVar17._0_4_) {
    fVar15 = ceilf(auVar17._4_4_ * (float)(int)uVar1);
    uVar9 = (ulong)(uint)(int)fVar15;
    if (iVar18 < (int)fVar15) {
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
    target_height = (uint)local_78;
  }
  else {
    fVar15 = ceilf(auVar17._0_4_ * (float)(int)uVar2);
    target_height = (int)fVar15;
    if ((int)(uint)local_78 < (int)fVar15) {
      target_height = (uint)local_78;
    }
  }
  local_68._8_16_ = (undefined1  [16])0x0;
  local_50 = (pointer)0x0;
  target_width = (int)uVar8;
  bicubic_resize(image,(clip_image_u8 *)local_68,target_width,target_height);
  local_90 = (undefined1  [16])0x0;
  local_80 = (pointer)0x0;
  iVar6 = local_48.width;
  iVar5 = (uint)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,
             (long)(int)(iVar18 * (uint)local_78 * 3));
  if (local_90._8_8_ != local_90._0_8_) {
    uVar9 = 0;
    do {
      *(uchar *)(local_90._0_8_ + uVar9) = pad_color._M_elems[0];
      *(uchar *)(local_90._0_8_ + uVar9 + 1) = pad_color._M_elems[1];
      *(uchar *)(local_90._0_8_ + uVar9 + 2) = pad_color._M_elems[2];
      uVar9 = uVar9 + 3;
    } while (uVar9 < (ulong)(local_90._8_8_ - local_90._0_8_));
  }
  if (0 < (int)target_height) {
    iVar7 = (((int)(iVar5 - target_height) / 2) * iVar18 + (iVar18 - target_width) / 2) * 3;
    lVar10 = 0;
    uVar9 = 0;
    do {
      if (0 < target_width) {
        uVar14 = 0;
        lVar11 = lVar10;
        iVar12 = iVar7;
        do {
          lVar13 = 0;
          do {
            *(uchar *)(local_90._0_8_ + lVar13 + iVar12) =
                 *(uchar *)(local_68._8_8_ + lVar13 + lVar11);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          uVar14 = uVar14 + 1;
          iVar12 = iVar12 + 3;
          lVar11 = lVar11 + 3;
        } while (uVar14 != uVar8);
      }
      uVar9 = uVar9 + 1;
      iVar7 = iVar7 + iVar18 * 3;
      lVar10 = lVar10 + (long)target_width * 3;
      local_78 = dst;
    } while (uVar9 != target_height);
  }
  dst->nx = iVar6;
  dst->ny = iVar5;
  puVar3 = (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_90._0_8_;
  (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_90._8_8_;
  (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_80;
  local_90 = (undefined1  [16])0x0;
  local_80 = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
    if ((pointer)local_90._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_90._0_8_,(long)local_80 - local_90._0_8_);
    }
  }
  if ((pointer)local_68._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._8_8_,(long)local_50 - local_68._8_8_);
  }
  return;
}

Assistant:

static void resize_and_pad_image(const clip_image_u8 & image, clip_image_u8 & dst, const clip_image_size & target_resolution, std::array<uint8_t, 3> pad_color = {0, 0, 0}) {
        int target_width  = target_resolution.width;
        int target_height = target_resolution.height;

        float scale_w = static_cast<float>(target_width) / image.nx;
        float scale_h = static_cast<float>(target_height) / image.ny;

        int new_width, new_height;

        if (scale_w < scale_h) {
            new_width  = target_width;
            new_height = std::min(static_cast<int>(std::ceil(image.ny * scale_w)), target_height);
        } else {
            new_height = target_height;
            new_width  = std::min(static_cast<int>(std::ceil(image.nx * scale_h)), target_width);
        }

        clip_image_u8 resized_image;
        bicubic_resize(image, resized_image, new_width, new_height);

        clip_image_u8 padded_image;
        padded_image.nx = target_width;
        padded_image.ny = target_height;
        padded_image.buf.resize(3 * target_width * target_height);

        // Fill the padded image with the fill color
        for (size_t i = 0; i < padded_image.buf.size(); i += 3) {
            padded_image.buf[i]     = pad_color[0];
            padded_image.buf[i + 1] = pad_color[1];
            padded_image.buf[i + 2] = pad_color[2];
        }

        // Calculate padding offsets
        int pad_x = (target_width  - new_width)  / 2;
        int pad_y = (target_height - new_height) / 2;

        // Copy the resized image into the center of the padded buffer
        for (int y = 0; y < new_height; ++y) {
            for (int x = 0; x < new_width; ++x) {
                for (int c = 0; c < 3; ++c) {
                    padded_image.buf[3 * ((y + pad_y) * target_width + (x + pad_x)) + c] = resized_image.buf[3 * (y * new_width + x) + c];
                }
            }
        }
        dst = std::move(padded_image);
    }